

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O2

void Curl_hsts_cleanup(hsts **hp)

{
  hsts *phVar1;
  void *pvVar2;
  Curl_llist_element *pCVar3;
  
  phVar1 = *hp;
  if (phVar1 != (hsts *)0x0) {
    pCVar3 = (phVar1->list).head;
    while (pCVar3 != (Curl_llist_element *)0x0) {
      pvVar2 = pCVar3->ptr;
      pCVar3 = pCVar3->next;
      (*Curl_cfree)(*(void **)((long)pvVar2 + 0x18));
      (*Curl_cfree)(pvVar2);
    }
    (*Curl_cfree)(phVar1->filename);
    (*Curl_cfree)(phVar1);
    *hp = (hsts *)0x0;
  }
  return;
}

Assistant:

void Curl_hsts_cleanup(struct hsts **hp)
{
  struct hsts *h = *hp;
  if(h) {
    struct Curl_llist_element *e;
    struct Curl_llist_element *n;
    for(e = h->list.head; e; e = n) {
      struct stsentry *sts = e->ptr;
      n = e->next;
      hsts_free(sts);
    }
    free(h->filename);
    free(h);
    *hp = NULL;
  }
}